

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_mul_v_s256_128_768(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [64];
  uint w;
  int iVar2;
  mzd_local_t *pmVar3;
  uint i;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  word local_c0;
  word wStack_b8;
  word wStack_b0;
  word wStack_a8;
  word wStack_a0;
  word wStack_98;
  word wStack_90;
  word wStack_88;
  word wStack_80;
  word wStack_78;
  word wStack_70;
  word wStack_68;
  
  iVar2 = 2;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  wStack_80 = auVar1._32_8_;
  wStack_78 = auVar1._40_8_;
  wStack_70 = auVar1._48_8_;
  wStack_68 = auVar1._56_8_;
  auVar1 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_c0 = auVar1._0_8_;
  wStack_b8 = auVar1._8_8_;
  wStack_b0 = auVar1._16_8_;
  wStack_a8 = auVar1._24_8_;
  wStack_a0 = auVar1._32_8_;
  wStack_98 = auVar1._40_8_;
  wStack_90 = auVar1._48_8_;
  wStack_88 = auVar1._56_8_;
  do {
    iVar4 = 0x40;
    do {
      pmVar3 = A;
      lVar5 = 0;
      auVar6 = vpbroadcastq_avx512vl();
      do {
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [32])((long)pmVar3->w64 + lVar5),auVar6,
                                     *(undefined1 (*) [32])((long)&local_c0 + lVar5),0x6a);
        *(undefined1 (*) [32])((long)&local_c0 + lVar5) = auVar7;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0x60);
      iVar4 = iVar4 + -1;
      A = pmVar3 + 3;
    } while (iVar4 != 0);
    A = pmVar3 + 3;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  c[1].w64[0] = wStack_a0;
  c[1].w64[1] = wStack_98;
  c[1].w64[2] = wStack_90;
  c[1].w64[3] = wStack_88;
  c[2].w64[0] = wStack_80;
  c[2].w64[1] = wStack_78;
  c[2].w64[2] = wStack_70;
  c[2].w64[3] = wStack_68;
  c->w64[0] = local_c0;
  c->w64[1] = wStack_b8;
  c->w64[2] = wStack_b0;
  c->w64[3] = wStack_a8;
  c[1].w64[0] = wStack_a0;
  c[1].w64[1] = wStack_98;
  c[1].w64[2] = wStack_90;
  c[1].w64[3] = wStack_88;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_mul_v_s256_128_768(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[3] = {mm256_zero, mm256_zero, mm256_zero};
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1) {
      const word256 mask = mm256_compute_mask(idx, 0);
      for (unsigned int j = 0; j < 3; ++j, ++Ablock) {
        cval[j] = mm256_xor_mask(cval[j], mm256_load(Ablock->w64), mask);
      }
    }
  }

  for (unsigned int j = 0; j < 3; ++j) {
    mm256_store(BLOCK(c, j)->w64, cval[j]);
  }
}